

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O1

TA_RetCode
TA_SAREXT_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                 int *outNBElement)

{
  TA_ParamHolderOptInput *pTVar1;
  TA_RetCode TVar2;
  
  pTVar1 = params->optIn;
  TVar2 = TA_SAREXT(startIdx,endIdx,(params->in->data).inPrice.high,(params->in->data).inPrice.low,
                    (pTVar1->data).optInReal,pTVar1[1].data.optInReal,pTVar1[2].data.optInReal,
                    pTVar1[3].data.optInReal,pTVar1[4].data.optInReal,pTVar1[5].data.optInReal,
                    pTVar1[6].data.optInReal,pTVar1[7].data.optInReal,outBegIdx,outNBElement,
                    (params->out->data).outReal);
  return TVar2;
}

Assistant:

TA_RetCode TA_SAREXT_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_SAREXT(
/* Generated */                startIdx,
/* Generated */                endIdx,
/* Generated */                params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                params->in[0].data.inPrice.low, /* inLow */
/* Generated */                params->optIn[0].data.optInReal, /* optInStartValue*/
/* Generated */                params->optIn[1].data.optInReal, /* optInOffsetOnReverse*/
/* Generated */                params->optIn[2].data.optInReal, /* optInAccelerationInitLong*/
/* Generated */                params->optIn[3].data.optInReal, /* optInAccelerationLong*/
/* Generated */                params->optIn[4].data.optInReal, /* optInAccelerationMaxLong*/
/* Generated */                params->optIn[5].data.optInReal, /* optInAccelerationInitShort*/
/* Generated */                params->optIn[6].data.optInReal, /* optInAccelerationShort*/
/* Generated */                params->optIn[7].data.optInReal, /* optInAccelerationMaxShort*/
/* Generated */                outBegIdx, 
/* Generated */                outNBElement, 
/* Generated */                params->out[0].data.outReal /*  outReal */ );
/* Generated */ }